

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_userdata.cpp
# Opt level: O2

int __thiscall
ON_UserStringList::SetUserStrings(ON_UserStringList *this,int count,ON_UserString *us,bool bReplace)

{
  ON_ClassArray<ON_UserString> *this_00;
  bool bVar1;
  int iVar2;
  ON__UINT32 OVar3;
  uint uVar4;
  int iVar5;
  ON_2dex *base;
  ON_2dex *pOVar6;
  size_t nel;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ON_UserString *pOVar14;
  int local_54;
  
  iVar5 = 0;
  if (us != (ON_UserString *)0x0 && 0 < count) {
    if (count == 1) {
      bVar1 = ON_wString::IsEmpty(&us->m_key);
      if (!bVar1) {
        iVar5 = 0;
        lVar9 = 0;
        for (lVar12 = 0; lVar12 < (this->m_e).m_count; lVar12 = lVar12 + 1) {
          iVar2 = ON_wString::CompareOrdinal
                            ((ON_wString *)((long)&(((this->m_e).m_a)->m_key).m_s + lVar9),
                             &us->m_key,true);
          if (iVar2 == 0) {
            if (!bReplace) {
              return 0;
            }
            bVar1 = ON_wString::IsEmpty(&us->m_string_value);
            if (bVar1) {
              ON_ClassArray<ON_UserString>::Remove(&this->m_e,(int)lVar12);
            }
            else {
              ON_UserString::operator=
                        ((ON_UserString *)((long)&(((this->m_e).m_a)->m_key).m_s + lVar9),us);
            }
            return 1;
          }
          lVar9 = lVar9 + 0x10;
        }
      }
    }
    else {
      uVar4 = (this->m_e).m_count;
      nel = (size_t)(int)(uVar4 + count);
      uVar8 = (ulong)(uint)count;
      base = (ON_2dex *)onmalloc((nel + uVar8) * 8);
      lVar9 = 0;
      uVar13 = 0;
      if (0 < (int)uVar4) {
        uVar13 = (ulong)uVar4;
      }
      for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
        OVar3 = ON_wString::DataCRCLower
                          ((ON_wString *)((long)&(((this->m_e).m_a)->m_key).m_s + lVar9),0);
        base[uVar10].i = OVar3;
        base[uVar10].j = (int)uVar10;
        lVar9 = lVar9 + 0x10;
      }
      pOVar14 = us;
      for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
        OVar3 = ON_wString::DataCRCLower(&pOVar14->m_key,0);
        base[nel + uVar13].i = OVar3;
        base[nel + uVar13].j = (int)uVar13;
        base[(long)(int)uVar4 + uVar13].i = OVar3;
        base[(long)(int)uVar4 + uVar13].j = uVar4 + (int)uVar13;
        pOVar14 = pOVar14 + 1;
      }
      this_00 = &this->m_e;
      ON_qsort(base,nel,8,cmp_hash_2dex_ij);
      ON_ClassArray<ON_UserString>::Reserve(this_00,nel);
      iVar5 = 0;
      local_54 = 0;
      for (uVar13 = 0; uVar13 != uVar8; uVar13 = uVar13 + 1) {
        pOVar14 = us + uVar13;
        bVar1 = ON_wString::IsEmpty(&pOVar14->m_key);
        if (!bVar1) {
          pOVar6 = ON_BinarySearch2dexArray(base[nel + uVar13].i,base,nel);
          if (pOVar6 == (ON_2dex *)0x0) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_userdata.cpp"
                       ,0x3cd,"","There is a bug in this function.");
          }
          else {
            uVar11 = (long)pOVar6 - (long)base >> 3;
            uVar10 = uVar11 + 1;
            for (; (uVar11 != 0 && (pOVar6[-1].i == pOVar6->i)); pOVar6 = pOVar6 + -1) {
              uVar10 = uVar10 - 1;
              uVar11 = uVar11 - 1;
            }
            do {
              uVar7 = uVar10;
              if ((nel <= uVar7) || (base[uVar7].i != base[uVar11].i)) break;
              uVar10 = uVar7 + 1;
            } while (base[uVar7].j <= (int)(uVar4 + (int)uVar13));
            if (base[uVar11].j < (int)uVar4) {
              for (; uVar11 < uVar7; uVar11 = uVar11 + 1) {
                if ((base[uVar11].j < (int)uVar4) &&
                   (iVar2 = ON_wString::CompareOrdinal
                                      (&(this->m_e).m_a[base[uVar11].j].m_key,&pOVar14->m_key,true),
                   iVar2 == 0)) {
                  if (bReplace) {
                    ON_UserString::operator=((this->m_e).m_a + base[uVar11].j,pOVar14);
                    iVar5 = iVar5 + 1;
                    bVar1 = ON_wString::IsEmpty(&pOVar14->m_string_value);
                    local_54 = local_54 + (uint)bVar1;
                  }
                  goto LAB_0065dcfa;
                }
              }
              bVar1 = ON_wString::IsEmpty(&pOVar14->m_string_value);
              if (!bVar1) {
                base[uVar11].j = uVar4;
                uVar4 = uVar4 + 1;
                ON_ClassArray<ON_UserString>::Append(this_00,pOVar14);
                iVar5 = iVar5 + 1;
              }
            }
            else {
              bVar1 = ON_wString::IsEmpty(&pOVar14->m_string_value);
              if (!bVar1) {
                base[uVar11].j = uVar4;
                uVar4 = uVar4 + 1;
                ON_ClassArray<ON_UserString>::Append(this_00,pOVar14);
                iVar5 = iVar5 + 1;
              }
            }
          }
        }
LAB_0065dcfa:
      }
      onfree(base);
      uVar4 = (this->m_e).m_count;
      while ((0 < (int)uVar4 && (0 < local_54))) {
        uVar4 = uVar4 - 1;
        bVar1 = ON_wString::IsEmpty(&(this->m_e).m_a[uVar4].m_string_value);
        if (bVar1) {
          ON_ClassArray<ON_UserString>::Remove(this_00,uVar4);
          local_54 = local_54 + -1;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int ON_UserStringList::SetUserStrings( int count, const ON_UserString* us, bool bReplace )
{
  int added_count = 0;
  int i;

  if ( count <= 0 || 0 == us )
    return 0;

  if ( 1 == count )
  {
    // skip the hash table hoo haa
    if (  us[0].m_key.IsEmpty() )
      return 0;
    for ( i = 0; i < m_e.Count(); i++ )
    {
      if ( m_e[i].m_key.CompareOrdinal(us[0].m_key, true ) )
        continue;
      if ( bReplace )
      {
        if ( us[0].m_string_value.IsEmpty() )
          m_e.Remove(i);
        else
          m_e[i] = us[0];
        added_count++;
      }
      break;
    }
    return added_count;
  }

  size_t k0, k1;
  int count0 = m_e.Count();
  size_t count0_plus_count = (size_t)(count0 + count);
  ON_2dex* hash = (ON_2dex*)onmalloc( (count0_plus_count + count)*sizeof(hash[0]) );
  ON_2dex* hash1 =  hash + (count0_plus_count);
  const ON_2dex* h;
  int deleted_count = 0;

  for ( i = 0; i < count0; i++ )
  {
    hash[i].i = (int)m_e[i].m_key.DataCRCLower(0);
    hash[i].j = i;
  }

  for ( i = 0; i < count; i++ )
  {
    hash1[i].i = (int)us[i].m_key.DataCRCLower(0);
    hash1[i].j = i;
    hash[i+count0].i = hash1[i].i;
    hash[i+count0].j = hash1[i].j+count0;
  }
  ON_qsort(hash,count0_plus_count,sizeof(hash[0]),cmp_hash_2dex_ij);

  m_e.Reserve(count0+count);
  for ( i = 0; i < count; i++)
  {
    if ( us[i].m_key.IsEmpty() )
      continue;

    // Set k0, k1 so that hash[k0]....,hash[k1-1] are 
    // the hash[] entries keys with the same hash code
    // as us[i].m_key.
    h = ON_BinarySearch2dexArray(hash1[i].i,hash,count0_plus_count);
    if ( 0 == h )
    {
      ON_ERROR("There is a bug in this function.");
      continue;
    }
    k0 = h-hash;
    while ( k0 > 0 && h[-1].i == h[0].i )
    {
      // set h = first element in hash[] with this hash code.
      k0--;
      h--;
    }
    for (k1 = k0+1; k1 < count0_plus_count; k1++ )
    {
      if ( hash[k1].i != hash[k0].i )
        break;
      if ( hash[k1].j > i+count0 )
        break;
    }

    if ( hash[k0].j >= count0 )
    {
      // There are no entries in m_e[] with key matching hash,
      // so us[i].m_key is not present in m_e.
      if ( !us[i].m_string_value.IsEmpty() )
      {
        hash[k0].j = count0++;
        m_e.Append(us[i]);
        added_count++;
      }
      continue;
    }

    for (/* empty init*/; k0 < k1; k0++ )
    {
      if ( hash[k0].j < count0 )
      {
        if ( m_e[hash[k0].j].m_key.CompareOrdinal(us[i].m_key,true) )
          continue; // different keys with same hash
        if ( bReplace )
        {
          m_e[hash[k0].j] = us[i];
          added_count++;
          if ( us[i].m_string_value.IsEmpty() )
            deleted_count++;
        }
        break;
      }
    }

    if ( k0 >= k1 )
    {
      // hash is unique up to this point, so us[i].m_key is unique, 
      // so we add it if it is valid.
      if ( !us[i].m_string_value.IsEmpty() )
      {
        hash[k0].j = count0++;
        m_e.Append(us[i]);
        added_count++;
      }
    }
  }

  onfree(hash);

  // remove deleted items.
  i = m_e.Count();
  while ( i-- > 0 && deleted_count > 0 )
  {
    if ( m_e[i].m_string_value.IsEmpty() )
    {
      m_e.Remove(i);
      deleted_count--;
    }
  }

  return added_count;
}